

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O2

void Logger::queueError<long,StringLiteral>
               (ErrorType type,char *text,long *args,StringLiteral *args_1)

{
  StringLiteral *in_R8;
  string_view text_00;
  string message;
  string local_30;
  
  tinyformat::format<long,StringLiteral>
            (&local_30,(tinyformat *)text,(char *)args,(long *)args_1,in_R8);
  text_00._M_str = (char *)args_1;
  text_00._M_len = (size_t)local_30._M_dataplus._M_p;
  queueError((Logger *)(ulong)type,(ErrorType)local_30._M_string_length,text_00);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}